

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O1

void __thiscall
TPZManVector<TPZMultiphysicsElement_*,_7>::Resize
          (TPZManVector<TPZMultiphysicsElement_*,_7> *this,int64_t newsize)

{
  long lVar1;
  TPZMultiphysicsElement **ppTVar2;
  long lVar3;
  TPZMultiphysicsElement **ppTVar4;
  ulong uVar5;
  double dVar6;
  
  if (-1 < newsize) {
    lVar1 = (this->super_TPZVec<TPZMultiphysicsElement_*>).fNElements;
    if (lVar1 != newsize) {
      lVar3 = (this->super_TPZVec<TPZMultiphysicsElement_*>).fNAlloc;
      if (lVar3 < newsize) {
        if (newsize < 8) {
          ppTVar2 = (this->super_TPZVec<TPZMultiphysicsElement_*>).fStore;
          ppTVar4 = this->fExtAlloc;
          if (ppTVar2 != ppTVar4) {
            if (0 < lVar1) {
              lVar3 = 0;
              do {
                ppTVar4[lVar3] = ppTVar2[lVar3];
                lVar3 = lVar3 + 1;
              } while (lVar1 != lVar3);
            }
            if (ppTVar2 != (TPZMultiphysicsElement **)0x0) {
              operator_delete__(ppTVar2);
            }
            (this->super_TPZVec<TPZMultiphysicsElement_*>).fStore = ppTVar4;
          }
          (this->super_TPZVec<TPZMultiphysicsElement_*>).fNElements = newsize;
          (this->super_TPZVec<TPZMultiphysicsElement_*>).fNAlloc = 0;
        }
        else {
          dVar6 = (double)lVar3 * 1.2;
          uVar5 = (long)dVar6;
          if (dVar6 < (double)newsize) {
            uVar5 = newsize;
          }
          ppTVar4 = (TPZMultiphysicsElement **)
                    operator_new__(-(ulong)(uVar5 >> 0x3d != 0) | uVar5 * 8);
          if (0 < lVar1) {
            ppTVar2 = (this->super_TPZVec<TPZMultiphysicsElement_*>).fStore;
            lVar3 = 0;
            do {
              ppTVar4[lVar3] = ppTVar2[lVar3];
              lVar3 = lVar3 + 1;
            } while (lVar1 != lVar3);
          }
          ppTVar2 = (this->super_TPZVec<TPZMultiphysicsElement_*>).fStore;
          if (ppTVar2 != (TPZMultiphysicsElement **)0x0 && ppTVar2 != this->fExtAlloc) {
            operator_delete__(ppTVar2);
          }
          (this->super_TPZVec<TPZMultiphysicsElement_*>).fStore = ppTVar4;
          (this->super_TPZVec<TPZMultiphysicsElement_*>).fNElements = newsize;
          (this->super_TPZVec<TPZMultiphysicsElement_*>).fNAlloc = uVar5;
        }
      }
      else {
        (this->super_TPZVec<TPZMultiphysicsElement_*>).fNElements = newsize;
      }
    }
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"TManVec::Resize. Bad parameter newsize.",0x27);
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + ' ');
  std::ostream::put(' ');
  std::ostream::flush();
  std::ostream::flush();
  return;
}

Assistant:

void TPZManVector< T, NumExtAlloc >::Resize(const int64_t newsize) {
#ifndef PZNODEBUG
    if (newsize < 0) {
        PZError << "TManVec::Resize. Bad parameter newsize." << std::endl;
        PZError.flush();
        return;
    }
#endif

    if (newsize == this->fNElements)
        return;

    if (newsize <= this->fNAlloc) {
        this->fNElements = newsize;
    } else if (newsize <= NumExtAlloc) { // that is, fExtAlloc != this->fStore
        if (this->fStore != fExtAlloc) {
            for (int64_t i = 0L; i < this->fNElements; i++) {
                fExtAlloc[i] = this->fStore[i];
            }
            delete [] this->fStore;
            this->fStore = fExtAlloc;
        }

        this->fNElements = newsize;
        this->fNAlloc = 0;
    } else { // the size is larger than the allocated memory, then this->fNElements
        // is always lower than newsize because fNElemets <=this->fNAllocs

        int64_t realsize = ExpandSize(newsize);
        T *newstore = new T[realsize];

        for (int64_t i = 0L; i < this->fNElements; i++) {
            newstore[i] = this->fStore[i];
        }

        if (this->fStore != fExtAlloc)
            delete [] this->fStore;

        this->fStore = newstore;
        this->fNElements = newsize;
        this->fNAlloc = realsize;
    }
}